

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncError UTF8ToUTF8(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  undefined4 local_44;
  undefined4 local_40;
  int ret;
  int len;
  int flush_local;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  void *vctxt_local;
  
  if (in == (uchar *)0x0) {
    *inlen = 0;
    *outlen = 0;
    vctxt_local._4_4_ = XML_ENC_ERR_SUCCESS;
  }
  else {
    if (*outlen < *inlen) {
      local_40 = *outlen;
      local_44 = XML_ENC_ERR_SPACE;
    }
    else {
      local_44 = *inlen;
      local_40 = local_44;
    }
    memcpy(out,in,(long)local_40);
    *outlen = local_40;
    *inlen = local_40;
    vctxt_local._4_4_ = local_44;
  }
  return vctxt_local._4_4_;
}

Assistant:

static xmlCharEncError
UTF8ToUTF8(void *vctxt ATTRIBUTE_UNUSED,
           unsigned char* out, int *outlen,
           const unsigned char* in, int *inlen,
           int flush ATTRIBUTE_UNUSED) {
    int len;
    int ret;

    if (in == NULL) {
        *inlen = 0;
        *outlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    if (*outlen < *inlen) {
	len = *outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
	len = *inlen;
        ret = len;
    }

    memcpy(out, in, len);

    *outlen = len;
    *inlen = len;
    return(ret);
}